

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.capnp.h
# Opt level: O0

void __thiscall
capnp::compiler::Declaration::Method::Results::Builder::adoptExplicit
          (Builder *this,Orphan<capnp::compiler::Declaration::ParamList> *value)

{
  PointerBuilder builder;
  uint uVar1;
  Orphan<capnp::compiler::Declaration::ParamList> *value_00;
  PointerBuilder local_30;
  Orphan<capnp::compiler::Declaration::ParamList> *local_18;
  Orphan<capnp::compiler::Declaration::ParamList> *value_local;
  Builder *this_local;
  
  local_18 = value;
  value_local = (Orphan<capnp::compiler::Declaration::ParamList> *)this;
  uVar1 = bounded<6u>();
  capnp::_::StructBuilder::setDataField<capnp::compiler::Declaration::Method::Results::Which>
            (&this->_builder,uVar1,EXPLICIT);
  uVar1 = bounded<6u>();
  capnp::_::StructBuilder::getPointerField(&local_30,&this->_builder,uVar1);
  value_00 = kj::mv<capnp::Orphan<capnp::compiler::Declaration::ParamList>>(local_18);
  builder.capTable = local_30.capTable;
  builder.segment = local_30.segment;
  builder.pointer = local_30.pointer;
  capnp::_::PointerHelpers<capnp::compiler::Declaration::ParamList,_(capnp::Kind)3>::adopt
            (builder,value_00);
  return;
}

Assistant:

inline void Declaration::Method::Results::Builder::adoptExplicit(
    ::capnp::Orphan< ::capnp::compiler::Declaration::ParamList>&& value) {
  _builder.setDataField<Declaration::Method::Results::Which>(
      ::capnp::bounded<6>() * ::capnp::ELEMENTS, Declaration::Method::Results::EXPLICIT);
  ::capnp::_::PointerHelpers< ::capnp::compiler::Declaration::ParamList>::adopt(_builder.getPointerField(
      ::capnp::bounded<6>() * ::capnp::POINTERS), kj::mv(value));
}